

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O2

void __thiscall ALCcontext::allocVoices(ALCcontext *this,size_t addcount)

{
  __pointer_type ptr;
  pointer puVar1;
  unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_> uVar2;
  long *plVar3;
  runtime_error *this_00;
  pointer puVar4;
  long lVar5;
  index_type count;
  ulong uVar6;
  bool bVar7;
  unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
  newarray;
  unique_ptr<Voice[],_std::default_delete<Voice[]>_> local_30;
  
  uVar6 = addcount + 0x1f >> 5;
  lVar5 = (long)(this->mVoiceClusters).
                super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mVoiceClusters).
                super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar6 < 0x3ffffffU - lVar5) {
    count = (lVar5 + uVar6) * 0x20;
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Increasing allocated voices to %zu\n",count);
    }
    al::FlexArray<Voice_*,_8UL>::Create((FlexArray<Voice_*,_8UL> *)&newarray,count);
    while (uVar2._M_t.
           super___uniq_ptr_impl<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_al::FlexArray<Voice_*,_8UL>_*,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
           .super__Head_base<0UL,_al::FlexArray<Voice_*,_8UL>_*,_false>._M_head_impl =
                newarray._M_t.
                super___uniq_ptr_impl<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_al::FlexArray<Voice_*,_8UL>_*,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
                .super__Head_base<0UL,_al::FlexArray<Voice_*,_8UL>_*,_false>._M_head_impl,
          bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      std::make_unique<Voice[]>((size_t)&local_30);
      std::
      vector<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,al::allocator<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,8ul>>
      ::emplace_back<std::unique_ptr<Voice[],std::default_delete<Voice[]>>>
                ((vector<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,al::allocator<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,8ul>>
                  *)&this->mVoiceClusters,&local_30);
      std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>::~unique_ptr(&local_30);
    }
    plVar3 = (long *)((long)newarray._M_t.
                            super___uniq_ptr_impl<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_al::FlexArray<Voice_*,_8UL>_*,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
                            .super__Head_base<0UL,_al::FlexArray<Voice_*,_8UL>_*,_false>.
                            _M_head_impl + 8);
    puVar1 = (this->mVoiceClusters).
             super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->mVoiceClusters).
                  super__Vector_base<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      for (lVar5 = 0; lVar5 != 0x5300; lVar5 = lVar5 + 0x298) {
        *plVar3 = (long)&(((puVar4->_M_t).
                           super___uniq_ptr_impl<Voice,_std::default_delete<Voice[]>_>._M_t.
                           super__Tuple_impl<0UL,_Voice_*,_std::default_delete<Voice[]>_>.
                           super__Head_base<0UL,_Voice_*,_false>._M_head_impl)->mProps).Position +
                  lVar5 + 0xffffffffffffffd0U;
        plVar3 = plVar3 + 1;
      }
    }
    newarray._M_t.
    super___uniq_ptr_impl<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_al::FlexArray<Voice_*,_8UL>_*,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
    .super__Head_base<0UL,_al::FlexArray<Voice_*,_8UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>,_true,_true>
          )(__uniq_ptr_impl<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
            )0x0;
    LOCK();
    ptr = (this->mVoices)._M_b._M_p;
    (this->mVoices)._M_b._M_p =
         (__pointer_type)
         uVar2._M_t.
         super___uniq_ptr_impl<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_al::FlexArray<Voice_*,_8UL>_*,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
         .super__Head_base<0UL,_al::FlexArray<Voice_*,_8UL>_*,_false>._M_head_impl;
    UNLOCK();
    if (ptr != (__pointer_type)0x0) {
      ALCdevice::waitForMix((this->mDevice).mPtr);
      al_free(ptr);
    }
    std::unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
    ::~unique_ptr(&newarray);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Allocating too many voices");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ALCcontext::allocVoices(size_t addcount)
{
    constexpr size_t clustersize{32};
    /* Convert element count to cluster count. */
    addcount = (addcount+(clustersize-1)) / clustersize;

    if(addcount >= std::numeric_limits<int>::max()/clustersize - mVoiceClusters.size())
        throw std::runtime_error{"Allocating too many voices"};
    const size_t totalcount{(mVoiceClusters.size()+addcount) * clustersize};
    TRACE("Increasing allocated voices to %zu\n", totalcount);

    auto newarray = VoiceArray::Create(totalcount);
    while(addcount)
    {
        mVoiceClusters.emplace_back(std::make_unique<Voice[]>(clustersize));
        --addcount;
    }

    auto voice_iter = newarray->begin();
    for(VoiceCluster &cluster : mVoiceClusters)
    {
        for(size_t i{0};i < clustersize;++i)
            *(voice_iter++) = &cluster[i];
    }

    if(auto *oldvoices = mVoices.exchange(newarray.release(), std::memory_order_acq_rel))
    {
        mDevice->waitForMix();
        delete oldvoices;
    }
}